

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_verify_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  ulong uVar2;
  long in_RDX;
  view_t *in_RSI;
  long in_RDI;
  uint64_t tmp4;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint m_1;
  uint64_t rvecm;
  uint64_t inm;
  uint m;
  uint64_t x2m [2];
  uint64_t x1s [2];
  uint64_t x0s [2];
  uint64_t r2m [2];
  uint64_t r1s [2];
  uint64_t r1m [2];
  uint64_t r0s [2];
  uint64_t r0m [2];
  uint local_b4;
  uint local_9c;
  uint64_t local_98 [4];
  uint64_t local_78 [2];
  uint64_t local_68 [2];
  uint64_t local_58 [2];
  uint64_t local_48 [2];
  uint64_t local_38 [2];
  uint64_t local_28 [3];
  view_t *local_10;
  long local_8;
  
  for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
    uVar1 = *(ulong *)(in_RDI + (ulong)local_9c * 8);
    uVar2 = *(ulong *)(in_RDX + (ulong)local_9c * 8);
    local_98[(ulong)local_9c + 4] = (uVar1 & 0x2492492400000000) << 2;
    local_98[(ulong)local_9c + 2] = (uVar1 & 0x4924924800000000) << 1;
    local_98[local_9c] = uVar1 & 0x9249249000000000;
    local_98[(ulong)local_9c + 0xe] = uVar2 & 0x2492492400000000;
    local_98[(ulong)local_9c + 10] = uVar2 & 0x4924924800000000;
    local_98[(ulong)local_9c + 6] = uVar2 & 0x9249249000000000;
    local_98[(ulong)local_9c + 0xc] = local_98[(ulong)local_9c + 0xe] << 2;
    local_98[(ulong)local_9c + 8] = local_98[(ulong)local_9c + 10] << 1;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  mpc_and_verify_uint64
            (local_98 + 0xe,local_98 + 4,local_98 + 2,local_98 + 6,in_RSI,0x9249249000000000,0);
  mpc_and_verify_uint64
            (local_98 + 6,local_98 + 2,local_98,local_98 + 8,local_10,0x9249249000000000,1);
  mpc_and_verify_uint64
            (local_98 + 10,local_98 + 4,local_98,local_98 + 0xc,local_10,0x9249249000000000,2);
  for (local_b4 = 0; local_b4 < 2; local_b4 = local_b4 + 1) {
    *(ulong *)(local_8 + (ulong)local_b4 * 8) =
         *(ulong *)(local_8 + (ulong)local_b4 * 8) & 0x3ffffffff ^
         local_98[(ulong)local_b4 + 4] ^ local_98[(ulong)local_b4 + 2] ^
         local_98[(ulong)local_b4 + 0xe] ^ local_98[local_b4] ^
         (local_98[(ulong)local_b4 + 6] ^ local_98[(ulong)local_b4 + 4]) >> 2 ^
         (local_98[(ulong)local_b4 + 4] ^ local_98[(ulong)local_b4 + 2] ^
         local_98[(ulong)local_b4 + 10]) >> 1;
  }
  return;
}

Assistant:

static void mpc_sbox_verify_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_VERIFY);

  mpc_and_verify_uint64(r0m, x0s, x1s, r2m, view, MASK_X2I, 0);
  mpc_and_verify_uint64(r2m, x1s, x2m, r1s, view, MASK_X2I, 1);
  mpc_and_verify_uint64(r1m, x0s, x2m, r0s, view, MASK_X2I, 2);

  bitsliced_step_2_uint64_10(SC_VERIFY);
}